

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O0

btScalar calcRollingFriction(btWheelContactPoint *contactPoint)

{
  long in_RDI;
  btScalar bVar1;
  btScalar vrel;
  btVector3 vel;
  btVector3 vel2;
  btVector3 vel1;
  btScalar maxImpulse;
  btVector3 rel_pos2;
  btVector3 rel_pos1;
  btVector3 *contactPosWorld;
  btScalar j1;
  undefined4 in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  btScalar in_stack_ffffffffffffff94;
  float local_3c;
  btScalar local_38 [4];
  btScalar local_28 [4];
  long local_18;
  float local_c;
  long local_8;
  
  local_c = 0.0;
  local_18 = in_RDI + 0x10;
  local_8 = in_RDI;
  btRigidBody::getCenterOfMassPosition((btRigidBody *)0x234fa1);
  local_28 = (btScalar  [4])
             operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (btVector3 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  btRigidBody::getCenterOfMassPosition((btRigidBody *)0x234fd4);
  local_38 = (btScalar  [4])
             operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (btVector3 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_3c = *(float *)(local_8 + 0x34);
  btRigidBody::getVelocityInLocalPoint
            ((btRigidBody *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (btVector3 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  btRigidBody::getVelocityInLocalPoint
            ((btRigidBody *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (btVector3 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
            (btVector3 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  bVar1 = btVector3::dot((btVector3 *)(local_8 + 0x20),(btVector3 *)&stack0xffffffffffffff94);
  local_c = -bVar1 * *(float *)(local_8 + 0x30);
  btSetMin<float>(&local_c,&local_3c);
  btSetMax<float>(&local_c,(float *)&stack0xffffffffffffff8c);
  return local_c;
}

Assistant:

btScalar calcRollingFriction(btWheelContactPoint& contactPoint)
{

	btScalar j1=0.f;

	const btVector3& contactPosWorld = contactPoint.m_frictionPositionWorld;

	btVector3 rel_pos1 = contactPosWorld - contactPoint.m_body0->getCenterOfMassPosition(); 
	btVector3 rel_pos2 = contactPosWorld - contactPoint.m_body1->getCenterOfMassPosition();
	
	btScalar maxImpulse  = contactPoint.m_maxImpulse;
	
	btVector3 vel1 = contactPoint.m_body0->getVelocityInLocalPoint(rel_pos1);
	btVector3 vel2 = contactPoint.m_body1->getVelocityInLocalPoint(rel_pos2);
	btVector3 vel = vel1 - vel2;

	btScalar vrel = contactPoint.m_frictionDirectionWorld.dot(vel);

	// calculate j that moves us to zero relative velocity
	j1 = -vrel * contactPoint.m_jacDiagABInv;
	btSetMin(j1, maxImpulse);
	btSetMax(j1, -maxImpulse);

	return j1;
}